

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

BaseType spirv_cross::to_signed_basetype(uint32_t width)

{
  CompilerError *this;
  BaseType local_c;
  uint32_t width_local;
  
  if (width == 8) {
    local_c = SByte;
  }
  else if (width == 0x10) {
    local_c = Short;
  }
  else if (width == 0x20) {
    local_c = Int;
  }
  else {
    if (width != 0x40) {
      this = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this,"Invalid bit width.");
      __cxa_throw(this,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_c = Int64;
  }
  return local_c;
}

Assistant:

static inline SPIRType::BaseType to_signed_basetype(uint32_t width)
{
	switch (width)
	{
	case 8:
		return SPIRType::SByte;
	case 16:
		return SPIRType::Short;
	case 32:
		return SPIRType::Int;
	case 64:
		return SPIRType::Int64;
	default:
		SPIRV_CROSS_THROW("Invalid bit width.");
	}
}